

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

bool __thiscall
OpenMD::FragmentStamp::isAtomInRigidBody
          (FragmentStamp *this,int atomIndex,int *whichRigidBody,int *consAtomIndex)

{
  RigidBodyStamp *this_00;
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  *whichRigidBody = -1;
  *consAtomIndex = -1;
  iVar2 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[atomIndex];
  uVar3 = 0;
  if (-1 < (long)iVar2) {
    *whichRigidBody = iVar2;
    this_00 = (this->rigidBodyStamps_).
              super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar2];
    uVar4 = (ulong)((long)(this_00->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this_00->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2;
    uVar5 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar5 = uVar3;
    }
    while (iVar2 = (int)uVar3, (int)uVar5 != iVar2) {
      iVar1 = RigidBodyStamp::getMemberAt(this_00,iVar2);
      if (iVar1 == atomIndex) {
        *consAtomIndex = iVar2;
        uVar3 = 1;
        goto LAB_00199abc;
      }
      uVar3 = (ulong)(iVar2 + 1);
    }
    uVar3 = 0;
  }
LAB_00199abc:
  return SUB81(uVar3,0);
}

Assistant:

bool FragmentStamp::isAtomInRigidBody(int atomIndex, int& whichRigidBody,
                                        int& consAtomIndex) {
    whichRigidBody = -1;
    consAtomIndex  = -1;

    if (atom2Rigidbody[atomIndex] >= 0) {
      whichRigidBody          = atom2Rigidbody[atomIndex];
      RigidBodyStamp* rbStamp = getRigidBodyStamp(whichRigidBody);
      int numAtom             = rbStamp->getNMembers();
      for (int j = 0; j < numAtom; j++) {
        if (rbStamp->getMemberAt(j) == atomIndex) {
          consAtomIndex = j;
          return true;
        }
      }
    }

    return false;
  }